

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlSAXParseDoc(xmlChar *cur,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  htmlDocPtr pxVar1;
  int iVar2;
  htmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  htmlParserCtxtPtr ctxt_00;
  
  if (cur == (xmlChar *)0x0) {
    return (htmlDocPtr)0x0;
  }
  ctxt = htmlNewSAXParserCtxt((htmlSAXHandler *)0x0,(void *)0x0);
  ctxt_00 = (htmlParserCtxtPtr)0x0;
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    value = xmlCtxtNewInputFromString(ctxt,(char *)0x0,(char *)cur,encoding,0);
    if (value != (xmlParserInputPtr)0x0) {
      iVar2 = xmlCtxtPushInput(ctxt,value);
      ctxt_00 = ctxt;
      if (-1 < iVar2) goto LAB_00169a4e;
      xmlFreeInputStream(value);
    }
    xmlFreeParserCtxt(ctxt);
    ctxt_00 = (htmlParserCtxtPtr)0x0;
  }
LAB_00169a4e:
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    return (htmlDocPtr)0x0;
  }
  if (sax != (htmlSAXHandlerPtr)0x0) {
    memcpy(ctxt_00->sax,sax,0x100);
    ctxt_00->userData = userData;
  }
  htmlParseDocument(ctxt_00);
  pxVar1 = ctxt_00->myDoc;
  xmlFreeParserCtxt(ctxt_00);
  return pxVar1;
}

Assistant:

htmlDocPtr
htmlSAXParseDoc(const xmlChar *cur, const char *encoding,
                htmlSAXHandlerPtr sax, void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return(NULL);

    ctxt = htmlCreateDocParserCtxt(cur, NULL, encoding);
    if (ctxt == NULL)
        return(NULL);

    if (sax != NULL) {
        *ctxt->sax = *sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    htmlFreeParserCtxt(ctxt);

    return(ret);
}